

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_error_code.hpp
# Opt level: O0

generic_code __thiscall
system_error2::_std_error_code_domain::_generic_code
          (_std_error_code_domain *this,status_code<void> *code)

{
  bool bVar1;
  status_code_domain *this_00;
  error_category *peVar2;
  value_type *pvVar3;
  error_category *peVar4;
  undefined8 extraout_RDX;
  generic_code gVar5;
  errc local_4c;
  value_type local_48;
  value_type local_44;
  undefined4 local_40 [2];
  error_condition cond;
  std_error_code *c;
  status_code<void> *code_local;
  _std_error_code_domain *this_local;
  undefined4 local_10;
  
  this_00 = status_code<void>::domain(code);
  bVar1 = status_code_domain::operator==(this_00,&this->super_status_code_domain);
  if (!bVar1) {
    __assert_fail("code.domain() == *this",
                  "/workspace/llm4binary/github/license_c_cmakelists/ned14[P]status-code/include/status-code/std_error_code.hpp"
                  ,0x113,
                  "virtual generic_code system_error2::_std_error_code_domain::_generic_code(const status_code<void> &) const"
                 );
  }
  peVar2 = mixins::
           mixin<system_error2::detail::status_code_storage<system_error2::_std_error_code_domain>,_system_error2::_std_error_code_domain>
           ::category((mixin<system_error2::detail::status_code_storage<system_error2::_std_error_code_domain>,_system_error2::_std_error_code_domain>
                       *)code);
  pvVar3 = detail::status_code_storage<system_error2::_std_error_code_domain>::value
                     ((status_code_storage<system_error2::_std_error_code_domain> *)code);
  local_40[0] = (**(code **)(*(long *)peVar2 + 0x28))(peVar2,*pvVar3);
  _cond = extraout_RDX;
  peVar2 = std::error_condition::category((error_condition *)local_40);
  peVar4 = (error_category *)std::_V2::generic_category();
  bVar1 = std::_V2::error_category::operator==(peVar2,peVar4);
  if (bVar1) {
    local_44 = std::error_condition::value((error_condition *)local_40);
    status_code<system_error2::_generic_code_domain>::status_code
              ((status_code<system_error2::_generic_code_domain> *)&this_local,&local_44);
  }
  else {
    peVar2 = std::error_condition::category((error_condition *)local_40);
    peVar4 = (error_category *)std::_V2::system_category();
    bVar1 = std::_V2::error_category::operator==(peVar2,peVar4);
    if (bVar1) {
      local_48 = std::error_condition::value((error_condition *)local_40);
      status_code<system_error2::_generic_code_domain>::status_code
                ((status_code<system_error2::_generic_code_domain> *)&this_local,&local_48);
    }
    else {
      local_4c = unknown;
      status_code<system_error2::_generic_code_domain>::
      status_code<system_error2::errc,_system_error2::status_code<system_error2::_generic_code_domain>,_true>
                ((status_code<system_error2::_generic_code_domain> *)&this_local,&local_4c);
    }
  }
  gVar5.
  super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
  .super_status_code_storage<system_error2::_generic_code_domain>._12_4_ = 0;
  gVar5.
  super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
  .super_status_code_storage<system_error2::_generic_code_domain>.super_status_code<void>._domain =
       &this_local->super_status_code_domain;
  gVar5.
  super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
  .super_status_code_storage<system_error2::_generic_code_domain>._value = local_10;
  return (generic_code)
         gVar5.
         super_mixin<system_error2::detail::status_code_storage<system_error2::_generic_code_domain>,_system_error2::_generic_code_domain>
         .super_status_code_storage<system_error2::_generic_code_domain>;
}

Assistant:

inline generic_code _std_error_code_domain::_generic_code(const status_code<void> &code) const noexcept
{
  assert(code.domain() == *this);
  const auto &c = static_cast<const std_error_code &>(code);  // NOLINT
  // Ask my embedded error code for its mapping to std::errc, which is a subset of our generic_code errc.
  std::error_condition cond(c.category().default_error_condition(c.value()));
  if(cond.category() == std::generic_category())
  {
    return generic_code(static_cast<errc>(cond.value()));
  }
#if !defined(SYSTEM_ERROR2_NOT_POSIX) && !defined(_WIN32)
  if(cond.category() == std::system_category())
  {
    return generic_code(static_cast<errc>(cond.value()));
  }
#endif
  return errc::unknown;
}